

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::skipSpacesInSource(Forth *this)

{
  byte bVar1;
  int iVar2;
  Cell CVar3;
  Cell CVar4;
  
  while( true ) {
    iVar2 = getSourceBufferRemain(this);
    if (iVar2 < 1) {
      return;
    }
    CVar3 = getSourceAddress(this);
    CVar4 = getSourceBufferOffset(this);
    bVar1 = dataSpaceAt(this,CVar3 + CVar4);
    iVar2 = isspace((uint)bVar1);
    if (iVar2 == 0) break;
    incSourceBufferOffset(this);
  }
  return;
}

Assistant:

void  skipSpacesInSource() {
				// Skip leading delimiters
				while(getSourceBufferRemain() > 0) {
					auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
					if (std::isspace(static_cast<unsigned char>(currentChar))) {
						incSourceBufferOffset();
					} else {
						return;
					}
				}
		}